

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O1

Node * __thiscall wasm::DataFlow::Graph::expandFromI1(Graph *this,Node *node,Expression *origin)

{
  bool bVar1;
  Node *pNVar2;
  
  if (node->type != Bad) {
    bVar1 = Node::returnsI1(node);
    if (bVar1) {
      pNVar2 = (Node *)operator_new(0x30);
      pNVar2->type = Zext;
      pNVar2->origin = (Expression *)0x0;
      (pNVar2->values).
      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pNVar2->values).
      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pNVar2->values).
      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Node::addValue(pNVar2,node);
      pNVar2->origin = origin;
      pNVar2 = addNode(this,pNVar2);
      return pNVar2;
    }
  }
  return node;
}

Assistant:

Node* expandFromI1(Node* node, Expression* origin) {
    if (!node->isBad() && node->returnsI1()) {
      node = addNode(Node::makeZext(node, origin));
    }
    return node;
  }